

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_ecmult_constants_sha(uint32_t prefix,size_t iter,uchar *expected32)

{
  int iVar1;
  secp256k1_scratch *scratch;
  size_t sVar2;
  uchar inp [6];
  uchar b32 [32];
  secp256k1_sha256 local_128;
  secp256k1_scalar local_b8;
  secp256k1_sha256 local_98;
  
  scratch = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  local_b8.d[0] = 0;
  local_b8.d[1] = 0;
  local_b8.d[2] = 0;
  local_b8.d[3] = 0;
  inp._0_4_ = prefix;
  test_ecmult_accumulate(&local_98,&local_b8,scratch);
  local_b8.d[0] = 1;
  local_b8.d[1] = 0;
  local_b8.d[2] = 0;
  local_b8.d[3] = 0;
  test_ecmult_accumulate(&local_98,&local_b8,scratch);
  secp256k1_scalar_negate(&local_b8,&local_b8);
  test_ecmult_accumulate(&local_98,&local_b8,scratch);
  for (sVar2 = 0; iter != sVar2; sVar2 = sVar2 + 1) {
    inp._4_2_ = (undefined2)sVar2;
    local_128.s[0] = 0x6a09e667;
    local_128.s[1] = 0xbb67ae85;
    local_128.s[2] = 0x3c6ef372;
    local_128.s[3] = 0xa54ff53a;
    local_128.s[4] = 0x510e527f;
    local_128.s[5] = 0x9b05688c;
    local_128.s[6] = 0x1f83d9ab;
    local_128.s[7] = 0x5be0cd19;
    local_128.bytes = 0;
    secp256k1_sha256_write(&local_128,inp,6);
    secp256k1_sha256_finalize(&local_128,b32);
    secp256k1_scalar_set_b32(&local_b8,b32,(int *)0x0);
    test_ecmult_accumulate(&local_98,&local_b8,scratch);
  }
  secp256k1_sha256_finalize(&local_98,b32);
  iVar1 = secp256k1_memcmp_var(b32,expected32,0x20);
  if (iVar1 == 0) {
    secp256k1_scratch_destroy(&CTX->error_callback,scratch);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x1588,"test condition failed: secp256k1_memcmp_var(b32, expected32, 32) == 0");
  abort();
}

Assistant:

static void test_ecmult_constants_sha(uint32_t prefix, size_t iter, const unsigned char* expected32) {
    /* Using test_ecmult_accumulate, test ecmult for:
     * - Key 0
     * - Key 1
     * - Key -1
     * - For i in range(iter):
     *   - Key SHA256(LE32(prefix) || LE16(i))
     */
    secp256k1_scalar x;
    secp256k1_sha256 acc;
    unsigned char b32[32];
    unsigned char inp[6];
    size_t i;
    secp256k1_scratch_space *scratch = secp256k1_scratch_space_create(CTX, 65536);

    inp[0] = prefix & 0xFF;
    inp[1] = (prefix >> 8) & 0xFF;
    inp[2] = (prefix >> 16) & 0xFF;
    inp[3] = (prefix >> 24) & 0xFF;
    secp256k1_sha256_initialize(&acc);
    secp256k1_scalar_set_int(&x, 0);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_set_int(&x, 1);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_negate(&x, &x);
    test_ecmult_accumulate(&acc, &x, scratch);

    for (i = 0; i < iter; ++i) {
        secp256k1_sha256 gen;
        inp[4] = i & 0xff;
        inp[5] = (i >> 8) & 0xff;
        secp256k1_sha256_initialize(&gen);
        secp256k1_sha256_write(&gen, inp, sizeof(inp));
        secp256k1_sha256_finalize(&gen, b32);
        secp256k1_scalar_set_b32(&x, b32, NULL);
        test_ecmult_accumulate(&acc, &x, scratch);
    }
    secp256k1_sha256_finalize(&acc, b32);
    CHECK(secp256k1_memcmp_var(b32, expected32, 32) == 0);

    secp256k1_scratch_space_destroy(CTX, scratch);
}